

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall qpdf::Tokenizer::inNumber(Tokenizer *this,char ch)

{
  bool bVar1;
  
  if (9 < (byte)(ch - 0x30U)) {
    if (ch == '.') {
      this->state = st_real;
    }
    else {
      bVar1 = is_delimiter(ch);
      if (bVar1) {
        this->type = tt_integer;
        this->state = st_token_ready;
        this->in_token = false;
        this->char_to_unread = ch;
      }
      else {
        this->state = st_literal;
      }
    }
  }
  return;
}

Assistant:

void
Tokenizer::inNumber(char ch)
{
    if (util::is_digit(ch)) {
    } else if (ch == '.') {
        state = st_real;
    } else if (isDelimiter(ch)) {
        type = tt::tt_integer;
        state = st_token_ready;
        in_token = false;
        char_to_unread = ch;
    } else {
        state = st_literal;
    }
}